

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O3

bool ShaderParserParse(string *base_path,string *path,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *watches,vector<RenderPass,_std::allocator<RenderPass>_> *render_passes,
                      vector<GUIComponent,_std::allocator<GUIComponent>_> *components,
                      string *read_file_error)

{
  size_type *psVar1;
  char cVar2;
  pointer pRVar3;
  long lVar4;
  _Alloc_hider _Var5;
  pointer pTVar6;
  pointer pTVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  string *line_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pTVar14;
  uint current_char;
  ulong uVar15;
  uint32_t local_244;
  pointer local_240;
  string line;
  vector<Texture,_std::allocator<Texture>_> textures;
  string prev_line;
  GUIComponent component;
  anon_class_8_1_efc841ae report_error;
  string source;
  string amalgamate;
  vector<GUIComponent,_std::allocator<GUIComponent>_> new_components;
  string gui_component_line;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  string *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<GUIComponent,_std::allocator<GUIComponent>_> previous_components;
  
  amalgamate._M_dataplus._M_p = (pointer)&amalgamate.field_2;
  amalgamate._M_string_length = 0;
  amalgamate.field_2._M_local_buf[0] = '\0';
  bVar8 = ShaderParserAmalgamate(base_path,path,watches,read_file_error,&amalgamate);
  if (!bVar8) {
    bVar8 = false;
    goto LAB_00119849;
  }
  new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = base_path;
  local_50 = watches;
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::vector(&previous_components,components);
  source._M_dataplus._M_p = (pointer)&source.field_2;
  source._M_string_length = 0;
  source.field_2._M_local_buf[0] = '\0';
  prev_line._M_dataplus._M_p = (pointer)&prev_line.field_2;
  prev_line._M_string_length = 0;
  prev_line.field_2._M_local_buf[0] = '\0';
  textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  report_error.read_file_error = read_file_error;
  if (amalgamate._M_string_length == 0) {
LAB_00119682:
    if ((render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<RenderPass,_std::allocator<RenderPass>_>::emplace_back<>(render_passes);
      std::__cxx11::string::operator=
                ((string *)
                 &(render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>).
                  _M_impl.super__Vector_impl_data._M_finish[-1].ShaderSource,(string *)&source);
      pRVar3 = (render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pRVar3[-1].IsMain = true;
      std::vector<Texture,_std::allocator<Texture>_>::operator=(&pRVar3[-1].Textures,&textures);
    }
LAB_001196c2:
    component.UniformName._M_string_length =
         (size_type)
         (components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    component._0_8_ =
         (components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
         super__Vector_impl_data._M_start;
    component.UniformName._M_dataplus._M_p =
         (pointer)(components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
    (components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
    super__Vector_impl_data._M_start =
         new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
         super__Vector_impl_data._M_start;
    (components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
         super__Vector_impl_data._M_finish;
    new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&component);
    bVar8 = true;
  }
  else {
    uVar12 = 0;
    local_240 = (pointer)0x0;
    local_244 = 0;
    do {
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      cVar2 = amalgamate._M_dataplus._M_p[uVar12];
      _Var5._M_p = (pointer)&line.field_2;
      while (line._M_dataplus._M_p = _Var5._M_p, cVar2 != '\n') {
        std::__cxx11::string::push_back((char)&line);
        lVar4 = uVar12 + 1;
        uVar12 = uVar12 + 1;
        _Var5 = line._M_dataplus;
        cVar2 = amalgamate._M_dataplus._M_p[lVar4];
      }
      uVar15 = 0xffffffff;
      do {
        current_char = (int)uVar15 + 1;
        uVar15 = (ulong)current_char;
        iVar9 = isspace((int)_Var5._M_p[uVar15]);
      } while (iVar9 != 0);
      if ((uVar15 < prev_line._M_string_length) && (prev_line._M_dataplus._M_p[uVar15] == '@')) {
        std::__cxx11::string::substr((ulong)&component,(ulong)&prev_line);
        iVar9 = std::__cxx11::string::compare((char *)&component);
        if ((size_type *)component._0_8_ != &component.UniformName._M_string_length) {
          operator_delete((void *)component._0_8_,component.UniformName._M_string_length + 1);
        }
        if (iVar9 == 0) {
          local_78._8_8_ = 0;
          local_78._M_unused._M_object = report_error.read_file_error;
          local_60 = std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/shaderparser.cpp:163:25)>
                     ::_M_invoke;
          local_68 = std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/shaderparser.cpp:163:25)>
                     ::_M_manager;
          bVar8 = ShaderParserParseTextures
                            (local_58,&prev_line,&line,current_char,local_244,
                             (FErrorReport *)&local_78,local_50,&textures);
          if (local_68 != (code *)0x0) {
            (*local_68)(&local_78,&local_78,__destroy_functor);
          }
joined_r0x001191b3:
          if (bVar8) goto LAB_001194ff;
LAB_0011943d:
          bVar8 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&component,(ulong)&prev_line);
          iVar9 = std::__cxx11::string::compare((char *)&component);
          if ((size_type *)component._0_8_ != &component.UniformName._M_string_length) {
            operator_delete((void *)component._0_8_,component.UniformName._M_string_length + 1);
          }
          if (iVar9 != 0) {
            std::__cxx11::string::substr((ulong)&component,(ulong)&prev_line);
            line_00 = (string *)0x15b849;
            iVar9 = std::__cxx11::string::compare((char *)&component);
            if ((size_type *)component._0_8_ != &component.UniformName._M_string_length) {
              line_00 = (string *)(component.UniformName._M_string_length + 1);
              operator_delete((void *)component._0_8_,(ulong)line_00);
            }
            if (iVar9 == 0) {
              component.Type = EGUIComponentTypeSlider1;
              component.UniformType = EGUIUniformTypeFloat;
              component.UniformName._M_dataplus._M_p =
                   component.UniformName._M_dataplus._M_p & 0xffffffff00000000;
              component.UniformName.field_2._8_8_ = 0;
              component.UniformName._M_string_length = 0;
              component.UniformName.field_2._M_allocated_capacity = 0;
              component._40_8_ = component.Data + 1;
              component._48_8_ = 0;
              component.Data._4_8_ = component.Data._4_8_ & 0xffffffffffffff00;
              local_98._8_8_ = 0;
              local_98._M_unused._M_object = report_error.read_file_error;
              local_80 = std::
                         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/shaderparser.cpp:163:25)>
                         ::_M_invoke;
              local_88 = std::
                         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/shaderparser.cpp:163:25)>
                         ::_M_manager;
              bVar8 = ShaderParserParseRenderPass
                                (&prev_line,line_00,current_char,local_244,(FErrorReport *)&local_98
                                 ,(value_type *)&component);
              if (local_88 != (code *)0x0) {
                (*local_88)(&local_98,&local_98,__destroy_functor);
              }
              if (bVar8) {
                std::vector<RenderPass,_std::allocator<RenderPass>_>::push_back
                          (render_passes,(value_type *)&component);
                local_240 = (render_passes->
                            super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
                            super__Vector_impl_data._M_finish + -1;
              }
              if ((float *)component._40_8_ != component.Data + 1) {
                operator_delete((void *)component._40_8_,component.Data._4_8_ + 1);
              }
              std::vector<Texture,_std::allocator<Texture>_>::~vector
                        ((vector<Texture,_std::allocator<Texture>_> *)
                         &component.UniformName._M_string_length);
              goto joined_r0x001191b3;
            }
            component._48_8_ = 0;
            component.Data[1] = 0.0;
            component.Data[2] = 0.0;
            component.UniformName.field_2._8_8_ = 0;
            component._40_8_ = 0;
            component.UniformName._M_string_length = 0;
            component.UniformName.field_2._M_allocated_capacity = 0;
            component.Type = EGUIComponentTypeSlider1;
            component.UniformType = EGUIUniformTypeFloat;
            component.UniformName._M_dataplus._M_p = (pointer)0x0;
            component.Data[3] = 0.0;
            component._68_4_ = 0;
            std::__cxx11::string::substr((ulong)&gui_component_line,(ulong)&prev_line);
            bVar8 = GUIComponentParse(local_244,&gui_component_line,&line,&previous_components,
                                      &component,read_file_error);
            if (bVar8) {
              std::vector<GUIComponent,_std::allocator<GUIComponent>_>::push_back
                        (&new_components,&component);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)gui_component_line._M_dataplus._M_p != &gui_component_line.field_2) {
                operator_delete(gui_component_line._M_dataplus._M_p,
                                gui_component_line.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)component.UniformName._M_dataplus._M_p != &component.UniformName.field_2) {
                operator_delete(component.UniformName._M_dataplus._M_p,
                                component.UniformName.field_2._M_allocated_capacity + 1);
              }
              goto LAB_001194ff;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)gui_component_line._M_dataplus._M_p != &gui_component_line.field_2) {
              operator_delete(gui_component_line._M_dataplus._M_p,
                              gui_component_line.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)component.UniformName._M_dataplus._M_p != &component.UniformName.field_2) {
              operator_delete(component.UniformName._M_dataplus._M_p,
                              component.UniformName.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0011943d;
          }
          if (local_240 != (pointer)0x0) {
            std::__cxx11::string::operator=((string *)&local_240->ShaderSource,(string *)&source);
            component.UniformName._M_string_length =
                 (size_type)
                 (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
            component._0_8_ =
                 (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl
                 .super__Vector_impl_data._M_start;
            component.UniformName._M_dataplus._M_p =
                 (pointer)(local_240->Textures).
                          super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
            super__Vector_impl_data._M_start =
                 textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<Texture,_std::allocator<Texture>_>::~vector
                      ((vector<Texture,_std::allocator<Texture>_> *)&component);
            pTVar7 = textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pTVar6 = textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                     super__Vector_impl_data._M_start;
            source._M_string_length = 0;
            *source._M_dataplus._M_p = '\0';
            local_240 = (pointer)0x0;
            if (textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                super__Vector_impl_data._M_start) {
              paVar13 = &((textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                           super__Vector_impl_data._M_start)->Binding).field_2;
              do {
                plVar10 = (long *)(((string *)(paVar13 + -1))->_M_dataplus)._M_p;
                if (paVar13 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar10) {
                  operator_delete(plVar10,paVar13->_M_allocated_capacity + 1);
                }
                pTVar14 = (pointer)((long)paVar13 + 0x18);
                paVar13 = paVar13 + 4;
              } while (pTVar14 != pTVar7);
              textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
              super__Vector_impl_data._M_finish = pTVar6;
              local_240 = (pointer)0x0;
            }
            goto LAB_001194ff;
          }
          component._0_8_ = &component.UniformName._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&component,"@pass_end was declared without @pass","");
          ShaderParserParse::anon_class_8_1_efc841ae::operator()
                    (&report_error,(string *)component._0_8_,
                     (uint32_t)component.UniformName._M_dataplus._M_p);
          if ((size_type *)component._0_8_ != &component.UniformName._M_string_length) {
            operator_delete((void *)component._0_8_,component.UniformName._M_string_length + 1);
          }
          bVar8 = false;
          local_240 = (pointer)0x0;
        }
      }
      else {
LAB_001194ff:
        if (line._M_dataplus._M_p[uVar15] != '@') {
          component._0_8_ = &component.UniformName._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&component,line._M_dataplus._M_p,
                     line._M_dataplus._M_p + line._M_string_length);
          std::__cxx11::string::append((char *)&component);
          std::__cxx11::string::_M_append((char *)&source,component._0_8_);
          if ((size_type *)component._0_8_ != &component.UniformName._M_string_length) {
            operator_delete((void *)component._0_8_,component.UniformName._M_string_length + 1);
          }
        }
        std::__cxx11::string::_M_assign((string *)&prev_line);
        local_244 = local_244 + 1;
        bVar8 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p,
                        CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                 line.field_2._M_local_buf[0]) + 1);
      }
      _Var5._M_p = prev_line._M_dataplus._M_p;
      if (!bVar8) {
        bVar8 = false;
        goto LAB_001197f1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < amalgamate._M_string_length);
    if (local_240 == (pointer)0x0) goto LAB_00119682;
    uVar12 = 0;
    do {
      uVar15 = uVar12;
      cVar2 = _Var5._M_p[uVar15];
      iVar9 = isspace((int)cVar2);
      uVar12 = (ulong)((int)uVar15 + 1);
    } while (iVar9 != 0);
    if ((cVar2 == '@') && (uVar15 < prev_line._M_string_length)) {
      std::__cxx11::string::operator=((string *)&local_240->ShaderSource,(string *)&source);
      component.UniformName._M_string_length =
           (size_type)
           (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      component._0_8_ =
           (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
           super__Vector_impl_data._M_start;
      component.UniformName._M_dataplus._M_p =
           (pointer)(local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
      super__Vector_impl_data._M_start =
           textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
           super__Vector_impl_data._M_start;
      (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
      super__Vector_impl_data._M_finish =
           textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (local_240->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      std::vector<Texture,_std::allocator<Texture>_>::~vector
                ((vector<Texture,_std::allocator<Texture>_> *)&component);
      goto LAB_001196c2;
    }
    std::operator+(&line,"Render pass ",&local_240->Output);
    plVar10 = (long *)std::__cxx11::string::append((char *)&line);
    psVar1 = &component.UniformName._M_string_length;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar11) {
      component.UniformName._M_string_length = *psVar11;
      component.UniformName.field_2._M_allocated_capacity = plVar10[3];
      component._0_8_ = psVar1;
    }
    else {
      component.UniformName._M_string_length = *psVar11;
      component._0_8_ = (size_type *)*plVar10;
    }
    component.UniformName._M_dataplus._M_p = (pointer)plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)read_file_error,(string *)&component);
    if ((size_type *)component._0_8_ != psVar1) {
      operator_delete((void *)component._0_8_,component.UniformName._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)line._M_dataplus._M_p != &line.field_2) {
      operator_delete(line._M_dataplus._M_p,
                      CONCAT71(line.field_2._M_allocated_capacity._1_7_,line.field_2._M_local_buf[0]
                              ) + 1);
    }
    bVar8 = false;
  }
LAB_001197f1:
  std::vector<Texture,_std::allocator<Texture>_>::~vector(&textures);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prev_line._M_dataplus._M_p != &prev_line.field_2) {
    operator_delete(prev_line._M_dataplus._M_p,
                    CONCAT71(prev_line.field_2._M_allocated_capacity._1_7_,
                             prev_line.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source._M_dataplus._M_p != &source.field_2) {
    operator_delete(source._M_dataplus._M_p,
                    CONCAT71(source.field_2._M_allocated_capacity._1_7_,
                             source.field_2._M_local_buf[0]) + 1);
  }
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector(&previous_components);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector(&new_components);
LAB_00119849:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)amalgamate._M_dataplus._M_p != &amalgamate.field_2) {
    operator_delete(amalgamate._M_dataplus._M_p,
                    CONCAT71(amalgamate.field_2._M_allocated_capacity._1_7_,
                             amalgamate.field_2._M_local_buf[0]) + 1);
  }
  return bVar8;
}

Assistant:

bool ShaderParserParse(const std::string& base_path, const std::string& path, std::vector<std::string>& watches, std::vector<RenderPass>& render_passes, std::vector<GUIComponent>& components, std::string& read_file_error) {
    std::string amalgamate;

    if (!ShaderParserAmalgamate(base_path, path, watches, read_file_error, amalgamate)) {
        return false;
    }

    std::vector<GUIComponent> new_components;
    std::vector<GUIComponent> previous_components = components;

    uint32_t line_number = 0;
    std::string source;
    std::string prev_line;
    std::vector<Texture> textures;
    RenderPass* pass = nullptr;

    auto report_error = [&](const std::string& error, uint32_t line_number) {
        read_file_error = error + " at line " + std::to_string(line_number);
    };

    for (size_t i = 0; i < amalgamate.size(); ++i) {
        std::string line;

        while (amalgamate[i] != '\n') {
            line += amalgamate[i];
            ++i;
        }

        uint32_t current_char = 0;
        while (isspace(line[current_char])) {
            ++current_char;
        }

        if (current_char < prev_line.length() && prev_line[current_char] == '@') {
            if (prev_line.substr(current_char + 1, current_char + 4) == "path") {
                if (!ShaderParserParseTextures(base_path, prev_line, line, current_char, line_number, report_error, watches, textures)) {
                    return false;
                }
            } else if (prev_line.substr(current_char + 1, current_char + 8) == "pass_end") {
                if (!pass) {
                    report_error("@pass_end was declared without @pass", line_number);
                    return false;
                }

                pass->ShaderSource = std::move(source);
                pass->Textures = std::move(textures);

                source.clear();
                textures.clear();

                pass = nullptr;
            } else if (prev_line.substr(current_char + 1, current_char + 4) == "pass") {
                RenderPass new_pass;
                if (!ShaderParserParseRenderPass(prev_line, line, current_char, line_number, report_error, new_pass)) {
                    return false;
                }

                render_passes.push_back(new_pass);
                pass = &render_passes.back();
            } else {
                GUIComponent component;
                std::string gui_component_line = prev_line.substr(current_char + 1, std::string::npos);
                if (!GUIComponentParse(line_number, gui_component_line, line, previous_components, component, read_file_error)) {
                    return false;
                }

                new_components.push_back(component);
            }
        }

        if (line[current_char] != '@') {
            source += line + "\n";
        }

        prev_line = line;
        ++line_number;
    }

    if (pass) {
        uint32_t current_char = 0;
        while (isspace(prev_line[current_char])) {
            ++current_char;
        }
        if (current_char < prev_line.length() && prev_line[current_char] == '@') {
            pass->ShaderSource = std::move(source);
            pass->Textures = std::move(textures);
        } else {
            read_file_error = "Render pass " + pass->Output + " was declared without @pass_end";
            return false;
        }
    } else  if (render_passes.empty()) {
        render_passes.emplace_back();
        render_passes.back().ShaderSource = std::move(source);
        render_passes.back().IsMain = true;
        render_passes.back().Textures = textures;
    }

    components = std::move(new_components);

    return true;
}